

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int dup_identity_check(char *id,lys_ident *ident,uint32_t size)

{
  uint local_28;
  uint32_t i;
  uint32_t size_local;
  lys_ident *ident_local;
  char *id_local;
  
  local_28 = 0;
  while( true ) {
    if (size <= local_28) {
      return 0;
    }
    if (id == ident[local_28].name) break;
    local_28 = local_28 + 1;
  }
  return 1;
}

Assistant:

static int
dup_identity_check(const char *id, struct lys_ident *ident, uint32_t size)
{
    uint32_t i;

    for (i = 0; i < size; i++) {
        if (ly_strequal(id, ident[i].name, 1)) {
            /* name collision */
            return EXIT_FAILURE;
        }
    }

    return EXIT_SUCCESS;
}